

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::DecodeConnectivity
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint uVar5;
  int32_t iVar6;
  int iVar7;
  int iVar8;
  DecoderBuffer *pDVar9;
  int64_t iVar10;
  char *pcVar11;
  size_t data_size;
  DecoderBuffer *this_00;
  ulong uVar12;
  size_type sVar13;
  reference pvVar14;
  uint *puVar15;
  long in_RDI;
  int32_t att_connectivity_verts;
  uint32_t i_1;
  int32_t c;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range3;
  uint32_t i;
  CornerIndex ci_1;
  CornerIndex ci;
  int num_connectivity_verts;
  DecoderBuffer traversal_end_buffer;
  DecoderBuffer event_buffer;
  uint32_t encoded_connectivity_size;
  int32_t topology_split_decoded_bytes;
  uint32_t num_encoded_split_symbols;
  uint32_t max_encoded_faces;
  uint32_t num_encoded_symbols;
  uint8_t num_attribute_data;
  uint32_t num_faces;
  uint32_t num_encoded_vertices;
  uint32_t num_new_verts;
  int in_stack_00000664;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *in_stack_00000668;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  MeshEdgebreakerTraversalDecoder *in_stack_fffffffffffffde0;
  CornerTable *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  MeshAttributeCornerTable *in_stack_fffffffffffffdf8;
  CornerTable *in_stack_fffffffffffffe00;
  undefined2 in_stack_fffffffffffffe2c;
  DecoderBuffer *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined2 in_stack_fffffffffffffe3c;
  undefined2 in_stack_fffffffffffffe3e;
  MeshAttributeCornerTable *in_stack_fffffffffffffeb8;
  ulong in_stack_fffffffffffffec0;
  uint local_11c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_118;
  uint local_114;
  int *local_110;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  vector<int,_std::allocator<int>_> *local_100;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_d0;
  int local_cc;
  DecoderBuffer local_c8;
  uint local_8c;
  DecoderBuffer local_88;
  uint local_50;
  int32_t local_4c;
  undefined1 local_45;
  int in_stack_ffffffffffffffc4;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *in_stack_ffffffffffffffc8;
  uint local_2c;
  uint local_24;
  byte local_1d;
  uint local_1c;
  undefined4 local_18;
  undefined4 local_14;
  byte local_1;
  
  *(undefined4 *)(in_RDI + 0x140) = 0;
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)0x1538a5);
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x202) {
    uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
    if (uVar2 < 0x200) {
      PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      bVar1 = DecoderBuffer::Decode<unsigned_int>
                        ((DecoderBuffer *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                         (uint *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_00154968;
      }
    }
    else {
      PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      bVar1 = DecodeVarint<unsigned_int>
                        ((uint *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (DecoderBuffer *)0x153934);
      if (!bVar1) {
        local_1 = 0;
        goto LAB_00154968;
      }
    }
    *(undefined4 *)(in_RDI + 0x140) = local_14;
  }
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x200) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                       (uint *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00154968;
    }
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (DecoderBuffer *)0x1539cc);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00154968;
    }
  }
  *(undefined4 *)(in_RDI + 0x180) = local_18;
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x200) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                       (uint *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00154968;
    }
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (DecoderBuffer *)0x153a5c);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00154968;
    }
  }
  uVar5 = std::numeric_limits<unsigned_int>::max();
  if (uVar5 / 3 < local_1c) {
    local_1 = 0;
    goto LAB_00154968;
  }
  if (local_1c * 3 < *(uint *)(in_RDI + 0x180)) {
    local_1 = 0;
    goto LAB_00154968;
  }
  PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
  bVar1 = DecoderBuffer::Decode<unsigned_char>
                    ((DecoderBuffer *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     (uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  if (!bVar1) {
    local_1 = 0;
    goto LAB_00154968;
  }
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x200) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                       (uint *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00154968;
    }
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (DecoderBuffer *)0x153b6e);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00154968;
    }
  }
  if (local_1c < local_24) {
    local_1 = 0;
    goto LAB_00154968;
  }
  if (local_24 + local_24 / 3 < local_1c) {
    local_1 = 0;
    goto LAB_00154968;
  }
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x200) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                       (uint *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00154968;
    }
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (DecoderBuffer *)0x153c5b);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00154968;
    }
  }
  if (local_24 < local_2c) {
    local_1 = 0;
    goto LAB_00154968;
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x153c9c);
  operator_new(0xa8);
  CornerTable::CornerTable(in_stack_fffffffffffffe00);
  std::unique_ptr<draco::CornerTable,std::default_delete<draco::CornerTable>>::
  unique_ptr<std::default_delete<draco::CornerTable>,void>
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (pointer)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator=
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             in_stack_fffffffffffffde0);
  bVar1 = std::operator==((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                           *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          (nullptr_t)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  if (bVar1) {
    local_1 = 0;
    goto LAB_00154968;
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x153d5d);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
             (size_type)in_stack_fffffffffffffdf8);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x153d8e);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
             (size_type)in_stack_fffffffffffffdf8);
  std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::clear
            ((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
              *)0x153dbc);
  std::vector<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>::clear
            ((vector<draco::HoleEventData,_std::allocator<draco::HoleEventData>_> *)0x153dcd);
  std::vector<bool,_std::allocator<bool>_>::clear
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::clear((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           *)0x153df2);
  *(undefined4 *)(in_RDI + 0xb8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xc0) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xbc) = 0xffffffff;
  std::
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
  ::clear((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
           *)0x153e24);
  std::
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
  ::resize((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
            *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
           (size_type)in_stack_fffffffffffffde8);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x153e53);
  bVar1 = CornerTable::Reset(in_stack_fffffffffffffde8,
                             (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                             (int)in_stack_fffffffffffffde0);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_00154968;
  }
  local_45 = 1;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),(bool *)0x153ec0);
  local_4c = -1;
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  if (uVar2 < 0x202) {
    uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
    if (uVar2 < 0x200) {
      PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      bVar1 = DecoderBuffer::Decode<unsigned_int>
                        ((DecoderBuffer *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                         (uint *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_00154968;
      }
    }
    else {
      PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      bVar1 = DecodeVarint<unsigned_int>
                        ((uint *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (DecoderBuffer *)0x153f5a);
      if (!bVar1) {
        local_1 = 0;
        goto LAB_00154968;
      }
    }
    if (local_50 != 0) {
      in_stack_fffffffffffffec0 = (ulong)local_50;
      pDVar9 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
      iVar10 = DecoderBuffer::remaining_size(pDVar9);
      if ((long)in_stack_fffffffffffffec0 <= iVar10) {
        DecoderBuffer::DecoderBuffer
                  ((DecoderBuffer *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        in_stack_fffffffffffffeb8 =
             (MeshAttributeCornerTable *)
             PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        pcVar11 = DecoderBuffer::data_head((DecoderBuffer *)in_stack_fffffffffffffeb8);
        uVar12 = (ulong)local_50;
        pDVar9 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        iVar10 = DecoderBuffer::remaining_size(pDVar9);
        pDVar9 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        uVar2 = DecoderBuffer::bitstream_version(pDVar9);
        DecoderBuffer::Init(&local_88,pcVar11 + uVar12,iVar10 - (ulong)local_50,uVar2);
        local_4c = DecodeHoleAndTopologySplitEvents
                             ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *)
                              CONCAT26(in_stack_fffffffffffffe3e,
                                       CONCAT24(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                                      ),in_stack_fffffffffffffe30);
        if (local_4c == -1) {
          local_1 = 0;
        }
        local_8c = (uint)(local_4c == -1);
        DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x154146);
        if (local_8c != 0) goto LAB_00154968;
        goto LAB_0015418f;
      }
    }
    local_1 = 0;
  }
  else {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    iVar6 = DecodeHoleAndTopologySplitEvents
                      ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *)
                       CONCAT26(in_stack_fffffffffffffe3e,
                                CONCAT24(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)),
                       in_stack_fffffffffffffe30);
    if (iVar6 == -1) {
      local_1 = 0;
      goto LAB_00154968;
    }
LAB_0015418f:
    MeshEdgebreakerTraversalDecoder::Init
              (in_stack_fffffffffffffde0,
               (MeshEdgebreakerDecoderImplInterface *)
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    MeshEdgebreakerTraversalDecoder::SetNumEncodedVertices
              ((MeshEdgebreakerTraversalDecoder *)(in_RDI + 0x210),
               *(int *)(in_RDI + 0x180) + local_2c);
    MeshEdgebreakerTraversalDecoder::SetNumAttributeData
              ((MeshEdgebreakerTraversalDecoder *)(in_RDI + 0x210),(uint)local_1d);
    DecoderBuffer::DecoderBuffer
              ((DecoderBuffer *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    bVar1 = MeshEdgebreakerTraversalDecoder::Start
                      ((MeshEdgebreakerTraversalDecoder *)
                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                       (DecoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    if (bVar1) {
      local_cc = DecodeConnectivity(in_stack_00000668,in_stack_00000664);
      if (local_cc == -1) {
        local_1 = 0;
      }
      else {
        pDVar9 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        pcVar11 = DecoderBuffer::data_head(&local_c8);
        data_size = DecoderBuffer::remaining_size(&local_c8);
        this_00 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
        uVar2 = DecoderBuffer::bitstream_version(this_00);
        DecoderBuffer::Init(pDVar9,pcVar11,data_size,uVar2);
        uVar3 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
        if (uVar3 < 0x202) {
          in_stack_fffffffffffffe30 = PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8))
          ;
          DecoderBuffer::Advance(in_stack_fffffffffffffe30,(long)local_4c);
        }
        bVar1 = std::
                vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                ::empty((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                         *)in_stack_fffffffffffffde0);
        if (!bVar1) {
          uVar4 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
          if (uVar4 < 0x201) {
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_d0,0);
            while( true ) {
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x15440b);
              uVar5 = CornerTable::num_corners((CornerTable *)0x154413);
              local_d4 = uVar5;
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<
                                (&local_d0,&local_d4);
              if (!bVar1) break;
              local_d8 = local_d0.value_;
              bVar1 = DecodeAttributeConnectivitiesOnFaceLegacy
                                ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>
                                  *)CONCAT26(uVar4,CONCAT24(in_stack_fffffffffffffe2c,uVar5)),
                                 (CornerIndex)(uint)((ulong)in_stack_fffffffffffffe30 >> 0x20));
              if (!bVar1) {
                local_1 = 0;
                goto LAB_0015495b;
              }
              local_dc = 3;
              local_e0 = (uint)IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+=
                                         (&local_d0,&local_dc);
            }
          }
          else {
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_e4,0);
            while( true ) {
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x1544f7);
              local_e8 = CornerTable::num_corners((CornerTable *)0x1544ff);
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<
                                (&local_e4,&local_e8);
              if (!bVar1) break;
              local_ec = local_e4.value_;
              bVar1 = DecodeAttributeConnectivitiesOnFace
                                ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>
                                  *)CONCAT26(uVar2,CONCAT24(uVar3,in_stack_fffffffffffffe38)),
                                 (CornerIndex)(uint)((ulong)this_00 >> 0x20));
              if (!bVar1) {
                local_1 = 0;
                goto LAB_0015495b;
              }
              local_f0 = 3;
              local_f4 = (uint)IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+=
                                         (&local_e4,&local_f0);
            }
          }
        }
        MeshEdgebreakerTraversalDecoder::Done
                  ((MeshEdgebreakerTraversalDecoder *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        for (local_f8 = 0; uVar12 = (ulong)local_f8,
            sVar13 = std::
                     vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                     ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                             *)(in_RDI + 0x1f8)), uVar12 < sVar13; local_f8 = local_f8 + 1) {
          std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8),(ulong)local_f8);
          std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::get
                    ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          MeshAttributeCornerTable::InitEmpty
                    (in_stack_fffffffffffffdf8,
                     (CornerTable *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          pvVar14 = std::
                    vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                    ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                                  *)(in_RDI + 0x1f8),(ulong)local_f8);
          local_100 = &pvVar14->attribute_seam_corners;
          local_108._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          local_110 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8
                                                ));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                                    ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8
                                                )), bVar1) {
            puVar15 = (uint *)__gnu_cxx::
                              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                              operator*(&local_108);
            local_114 = *puVar15;
            pvVar14 = std::
                      vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                      ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                                    *)(in_RDI + 0x1f8),(ulong)local_f8);
            in_stack_fffffffffffffdf8 = &pvVar14->connectivity_data;
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_118,local_114);
            MeshAttributeCornerTable::AddSeamEdge
                      (in_stack_fffffffffffffeb8,
                       (CornerIndex)(uint)(in_stack_fffffffffffffec0 >> 0x20));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_108);
          }
          std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8),(ulong)local_f8);
          bVar1 = MeshAttributeCornerTable::RecomputeVertices
                            ((MeshAttributeCornerTable *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                             (Mesh *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                             (PointAttribute *)
                             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          in_stack_fffffffffffffdf4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdf4);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_0015495b;
          }
        }
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x1547ce);
        CornerTable::num_vertices((CornerTable *)0x1547d6);
        MeshAttributeIndicesEncodingData::Init
                  ((MeshAttributeIndicesEncodingData *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdcc);
        local_11c = 0;
        while( true ) {
          uVar12 = (ulong)local_11c;
          sVar13 = std::
                   vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                   ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                           *)(in_RDI + 0x1f8));
          if (sVar13 <= uVar12) break;
          std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8),(ulong)local_11c);
          iVar7 = MeshAttributeCornerTable::num_vertices((MeshAttributeCornerTable *)0x154851);
          std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                    ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                     0x15487e);
          iVar8 = CornerTable::num_vertices((CornerTable *)0x154886);
          if (iVar7 < iVar8) {
            std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                       0x1548a9);
            in_stack_fffffffffffffdd0 = CornerTable::num_vertices((CornerTable *)0x1548b1);
          }
          std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8),(ulong)local_11c);
          MeshAttributeIndicesEncodingData::Init
                    ((MeshAttributeIndicesEncodingData *)CONCAT44(iVar7,in_stack_fffffffffffffdd0),
                     in_stack_fffffffffffffdcc);
          local_11c = local_11c + 1;
        }
        bVar1 = AssignPointsToCorners(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
        if (bVar1) {
          local_1 = 1;
        }
        else {
          local_1 = 0;
        }
      }
    }
    else {
      local_1 = 0;
    }
LAB_0015495b:
    local_8c = 1;
    DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x154968);
  }
LAB_00154968:
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::DecodeConnectivity() {
  num_new_vertices_ = 0;
  new_to_parent_vertex_map_.clear();
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t num_new_verts;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&num_new_verts)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&num_new_verts, decoder_->buffer())) {
        return false;
      }
    }
    num_new_vertices_ = num_new_verts;
  }
#endif

  uint32_t num_encoded_vertices;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_vertices)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_vertices, decoder_->buffer())) {
      return false;
    }
  }
  num_encoded_vertices_ = num_encoded_vertices;

  uint32_t num_faces;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_faces)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, decoder_->buffer())) {
      return false;
    }
  }
  if (num_faces > std::numeric_limits<CornerIndex::ValueType>::max() / 3) {
    return false;  // Draco cannot handle this many faces.
  }

  if (static_cast<uint32_t>(num_encoded_vertices_) > num_faces * 3) {
    return false;  // There cannot be more vertices than 3 * num_faces.
  }
  uint8_t num_attribute_data;
  if (!decoder_->buffer()->Decode(&num_attribute_data)) {
    return false;
  }

  uint32_t num_encoded_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_faces < num_encoded_symbols) {
    // Number of faces needs to be the same or greater than the number of
    // symbols (it can be greater because the initial face may not be encoded as
    // a symbol).
    return false;
  }
  const uint32_t max_encoded_faces =
      num_encoded_symbols + (num_encoded_symbols / 3);
  if (num_faces > max_encoded_faces) {
    // Faces can only be 1 1/3 times bigger than number of encoded symbols. This
    // could only happen if all new encoded components started with interior
    // triangles. E.g. A mesh with multiple tetrahedrons.
    return false;
  }

  uint32_t num_encoded_split_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_split_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_split_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_encoded_split_symbols > num_encoded_symbols) {
    return false;  // Split symbols are a sub-set of all symbols.
  }

  // Decode topology (connectivity).
  vertex_traversal_length_.clear();
  corner_table_ = std::unique_ptr<CornerTable>(new CornerTable());
  if (corner_table_ == nullptr) {
    return false;
  }
  processed_corner_ids_.clear();
  processed_corner_ids_.reserve(num_faces);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(num_faces);
  topology_split_data_.clear();
  hole_event_data_.clear();
  init_face_configurations_.clear();
  init_corners_.clear();

  last_symbol_id_ = -1;
  last_face_id_ = -1;
  last_vert_id_ = -1;

  attribute_data_.clear();
  // Add one attribute data for each attribute decoder.
  attribute_data_.resize(num_attribute_data);

  if (!corner_table_->Reset(
          num_faces, num_encoded_vertices_ + num_encoded_split_symbols)) {
    return false;
  }

  // Start with all vertices marked as holes (boundaries).
  // Only vertices decoded with TOPOLOGY_C symbol (and the initial face) will
  // be marked as non hole vertices. We need to allocate the array larger
  // because split symbols can create extra vertices during the decoding
  // process (these extra vertices are then eliminated during deduplication).
  is_vert_hole_.assign(num_encoded_vertices_ + num_encoded_split_symbols, true);

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  int32_t topology_split_decoded_bytes = -1;
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t encoded_connectivity_size;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&encoded_connectivity_size)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&encoded_connectivity_size, decoder_->buffer())) {
        return false;
      }
    }
    if (encoded_connectivity_size == 0 ||
        encoded_connectivity_size > decoder_->buffer()->remaining_size()) {
      return false;
    }
    DecoderBuffer event_buffer;
    event_buffer.Init(
        decoder_->buffer()->data_head() + encoded_connectivity_size,
        decoder_->buffer()->remaining_size() - encoded_connectivity_size,
        decoder_->buffer()->bitstream_version());
    // Decode hole and topology split events.
    topology_split_decoded_bytes =
        DecodeHoleAndTopologySplitEvents(&event_buffer);
    if (topology_split_decoded_bytes == -1) {
      return false;
    }

  } else
#endif
  {
    if (DecodeHoleAndTopologySplitEvents(decoder_->buffer()) == -1) {
      return false;
    }
  }

  traversal_decoder_.Init(this);
  // Add one extra vertex for each split symbol.
  traversal_decoder_.SetNumEncodedVertices(num_encoded_vertices_ +
                                           num_encoded_split_symbols);
  traversal_decoder_.SetNumAttributeData(num_attribute_data);

  DecoderBuffer traversal_end_buffer;
  if (!traversal_decoder_.Start(&traversal_end_buffer)) {
    return false;
  }

  const int num_connectivity_verts = DecodeConnectivity(num_encoded_symbols);
  if (num_connectivity_verts == -1) {
    return false;
  }

  // Set the main buffer to the end of the traversal.
  decoder_->buffer()->Init(traversal_end_buffer.data_head(),
                           traversal_end_buffer.remaining_size(),
                           decoder_->buffer()->bitstream_version());

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Skip topology split data that was already decoded earlier.
    decoder_->buffer()->Advance(topology_split_decoded_bytes);
  }
#endif

  // Decode connectivity of non-position attributes.
  if (!attribute_data_.empty()) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 1)) {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFaceLegacy(ci)) {
          return false;
        }
      }

    } else
#endif
    {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFace(ci)) {
          return false;
        }
      }
    }
  }
  traversal_decoder_.Done();

  // Decode attribute connectivity.
  // Prepare data structure for decoding non-position attribute connectivity.
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    attribute_data_[i].connectivity_data.InitEmpty(corner_table_.get());
    // Add all seams.
    for (int32_t c : attribute_data_[i].attribute_seam_corners) {
      attribute_data_[i].connectivity_data.AddSeamEdge(CornerIndex(c));
    }
    // Recompute vertices from the newly added seam edges.
    if (!attribute_data_[i].connectivity_data.RecomputeVertices(nullptr,
                                                                nullptr)) {
      return false;
    }
  }

  pos_encoding_data_.Init(corner_table_->num_vertices());
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    // For non-position attributes, preallocate the vertex to value mapping
    // using the maximum number of vertices from the base corner table and the
    // attribute corner table (since the attribute decoder may use either of
    // it).
    int32_t att_connectivity_verts =
        attribute_data_[i].connectivity_data.num_vertices();
    if (att_connectivity_verts < corner_table_->num_vertices()) {
      att_connectivity_verts = corner_table_->num_vertices();
    }
    attribute_data_[i].encoding_data.Init(att_connectivity_verts);
  }
  if (!AssignPointsToCorners(num_connectivity_verts)) {
    return false;
  }
  return true;
}